

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash2012.c
# Opt level: O0

void init_gost2012_hash_ctx(gost2012_hash_ctx *CTX,uint digest_size)

{
  int in_ESI;
  void *in_RDI;
  
  memset(in_RDI,0,0x110);
  *(int *)((long)in_RDI + 0x108) = in_ESI;
  if (in_ESI == 0x100) {
    memset((void *)((long)in_RDI + 0x40),1,0x40);
  }
  return;
}

Assistant:

void init_gost2012_hash_ctx(gost2012_hash_ctx * CTX,
                            const unsigned int digest_size)
{
    memset(CTX, 0, sizeof(gost2012_hash_ctx));

    CTX->digest_size = digest_size;
    /*
     * IV for 512-bit hash should be 0^512
     * IV for 256-bit hash should be (00000001)^64
     *
     * It's already zeroed when CTX is cleared above, so we only
     * need to set it to 0x01-s for 256-bit hash.
     */
    if (digest_size == 256)
        memset(&CTX->h, 0x01, sizeof(uint512_u));
}